

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

int get_symbol_value(ListNode *head,char **symbol_names,size_t number_of_symbol_names,void **output)

{
  char *value;
  ListNode *node;
  int iVar1;
  uint uVar2;
  int iVar3;
  ListNode **output_00;
  ListNode *head_00;
  long in_FS_OFFSET;
  ListNode *value_node;
  ListNode *target_node;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  target_node = (ListNode *)0x0;
  _assert_true((unsigned_long)head,"head",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
               ,0x314);
  _assert_true((unsigned_long)symbol_names,"symbol_names",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
               ,0x315);
  _assert_true(number_of_symbol_names,"number_of_symbol_names",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
               ,0x316);
  output_00 = (ListNode **)0x317;
  _assert_true((unsigned_long)output,"output",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
               ,0x317);
  value = *symbol_names;
  iVar1 = list_find(head,value,(EqualityFunction)&target_node,output_00);
  node = target_node;
  if (iVar1 == 0) {
LAB_0010899e:
    iVar1 = 0;
    cm_print_error("No entries for symbol %s.\n",value);
  }
  else {
    _assert_true((unsigned_long)target_node,"target_node",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
                 ,0x31e);
    _assert_true((unsigned_long)node->value,"target_node->value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
                 ,799);
    head_00 = (ListNode *)((long)node->value + 8);
    if (number_of_symbol_names == 1) {
      value_node = (ListNode *)0x0;
      uVar2 = list_first(head_00,&value_node);
      _assert_true((ulong)uVar2,"return_value",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
                   ,0x327);
      if (uVar2 == 0) goto LAB_0010899e;
      *output = value_node->value;
      iVar1 = value_node->refcount;
      if (iVar1 == 1) {
        list_remove_free(value_node,(CleanupListValue)0x0,(void *)0x0);
      }
      else if (-2 < iVar1) {
        value_node->refcount = iVar1 + -1;
      }
    }
    else {
      iVar1 = get_symbol_value(head_00,symbol_names + 1,1,output);
    }
    iVar3 = list_empty(head_00);
    if (iVar3 != 0) {
      list_remove_free(node,free_symbol_map_value,(void *)0x0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int get_symbol_value(
        ListNode * const head, const char * const symbol_names[],
        const size_t number_of_symbol_names, void **output) {
    const char* symbol_name = NULL;
    ListNode *target_node = NULL;
    assert_non_null(head);
    assert_non_null(symbol_names);
    assert_true(number_of_symbol_names);
    assert_non_null(output);
    symbol_name = symbol_names[0];

    if (list_find(head, symbol_name, symbol_names_match, &target_node)) {
        SymbolMapValue *map_value = NULL;
        ListNode *child_list = NULL;
        int return_value = 0;
        assert_non_null(target_node);
        assert_non_null(target_node->value);

        map_value = (SymbolMapValue*)target_node->value;
        child_list = &map_value->symbol_values_list_head;

        if (number_of_symbol_names == 1) {
            ListNode *value_node = NULL;
            return_value = list_first(child_list, &value_node);
            assert_true(return_value);
            /* Add a check to silence clang analyzer */
            if (return_value == 0) {
                goto out;
            }
            *output = (void*) value_node->value;
            return_value = value_node->refcount;
            if (value_node->refcount - 1 == 0) {
                list_remove_free(value_node, NULL, NULL);
            } else if (value_node->refcount > WILL_RETURN_ONCE) {
                --value_node->refcount;
            }
        } else {
            return_value = get_symbol_value(
                child_list, &symbol_names[1], number_of_symbol_names - 1,
                output);
        }
        if (list_empty(child_list)) {
            list_remove_free(target_node, free_symbol_map_value, (void*)0);
        }
        return return_value;
    }
out:
    cm_print_error("No entries for symbol %s.\n", symbol_name);
    return 0;
}